

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  pStack_c8;
  TagAlias local_78;
  char *local_48;
  size_t sStack_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pStack_c8,"[@",(allocator<char> *)&local_78);
  bVar2 = startsWith(alias,&pStack_c8.first);
  if ((bVar2) && (alias->_M_string_length != 0)) {
    cVar1 = (alias->_M_dataplus)._M_p[alias->_M_string_length - 1];
    std::__cxx11::string::~string((string *)&pStack_c8);
    if (cVar1 == ']') {
      local_48 = lineInfo->file;
      sStack_40 = lineInfo->line;
      std::__cxx11::string::string((string *)&local_78,tag);
      local_78.lineInfo.file = local_48;
      local_78.lineInfo.line = sStack_40;
      clara::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
      ::pair<Catch::TagAlias,_true>(&pStack_c8,alias,&local_78);
      pVar4 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagAlias>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                          *)&this->m_registry,&pStack_c8);
      clara::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
      ::~pair(&pStack_c8);
      std::__cxx11::string::~string((string *)&local_78);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return;
      }
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_78);
      std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,"error: tag alias, \'");
      std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,(string *)alias);
      std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,
                      "\' already registered.\n");
      std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,"\tFirst seen at: ");
      iVar3 = (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(this,alias);
      Catch::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,
                        (SourceLineInfo *)(CONCAT44(extraout_var,iVar3) + 0x20));
      std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,"\n");
      std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,"\tRedefined at: ");
      Catch::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,lineInfo);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&pStack_c8.first);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&pStack_c8);
  }
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_78);
  std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,"error: tag alias, \'");
  std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,(string *)alias);
  std::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,
                  "\' is not of the form [@alias name].\n");
  Catch::operator<<((ostream *)local_78.tag.field_2._M_allocated_capacity,lineInfo);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&pStack_c8.first);
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {
        CATCH_ENFORCE( startsWith(alias, "[@") && endsWith(alias, ']'),
                      "error: tag alias, '" << alias << "' is not of the form [@alias name].\n" << lineInfo );

        CATCH_ENFORCE( m_registry.insert(std::make_pair(alias, TagAlias(tag, lineInfo))).second,
                      "error: tag alias, '" << alias << "' already registered.\n"
                      << "\tFirst seen at: " << find(alias)->lineInfo << "\n"
                      << "\tRedefined at: " << lineInfo );
    }